

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O2

int lrtr_ipv6_addr_to_str(lrtr_ipv6_addr *ip_addr,char *b,uint len)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  byte bVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint16_t uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  uint16_t words [8];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (len < 0x2e) {
    iVar10 = -1;
    goto LAB_0010435c;
  }
  bVar4 = 0;
  uVar12 = 0;
  iVar10 = 0;
  uVar8 = 0;
  iVar6 = 0;
  for (uVar7 = 0; iVar11 = (int)uVar12, uVar7 != 8; uVar7 = uVar7 + 1) {
    uVar9 = (uint16_t)(ip_addr->addr[uVar7 >> 1 & 0x7fffffff] >> (~bVar4 & 0x10));
    words[uVar7] = uVar9;
    iVar11 = 0;
    if (uVar9 == 0) {
      if (iVar6 == 0) {
        uVar8 = uVar7 & 0xffffffff;
      }
      iVar11 = iVar6 + 1;
      if (iVar10 <= iVar6) {
        uVar12 = uVar8;
        iVar10 = iVar11;
      }
    }
    iVar6 = iVar11;
    bVar4 = bVar4 + 0x10;
  }
  if (iVar10 < 2) {
    iVar11 = -1;
  }
  if (iVar11 == 0) {
    if (iVar10 == 5) {
      if (ip_addr->addr[2] == 0xffff) {
        pcVar5 = "ffff:";
        goto LAB_001043b9;
      }
      goto LAB_001042f1;
    }
    if (iVar10 != 6) goto LAB_001042f1;
    pcVar5 = "ffff:";
    if (ip_addr->addr[2] == 0) {
      pcVar5 = "";
    }
LAB_001043b9:
    uVar1 = ip_addr->addr[3];
    sprintf(b,"::%s%d.%d.%d.%d",pcVar5,(ulong)(uVar1 >> 0x18),(ulong)(uVar1 >> 0x10 & 0xff),
            (ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
  }
  else {
LAB_001042f1:
    iVar6 = iVar10 + iVar11 + -1;
    for (iVar10 = 0; iVar10 < 8; iVar10 = iVar10 + 1) {
      if (iVar10 == iVar11) {
        *b = ':';
        if (iVar6 == 7) {
          b[1] = ':';
          b = b + 2;
          iVar10 = 7;
        }
        else {
          b = b + 1;
          iVar10 = iVar6;
        }
      }
      else {
        if (iVar10 != 0) {
          *b = ':';
          b = b + 1;
        }
        iVar3 = sprintf(b,"%x",(ulong)words[iVar10]);
        b = b + iVar3;
      }
    }
    *b = '\0';
  }
  iVar10 = 0;
LAB_0010435c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar10;
  }
  __stack_chk_fail();
}

Assistant:

int lrtr_ipv6_addr_to_str(const struct lrtr_ipv6_addr *ip_addr, char *b, const unsigned int len)
{
	if (len < INET6_ADDRSTRLEN)
		return -1;
	const uint32_t *a = ip_addr->addr;
	uint16_t words[8];
	int bestpos = 0;
	int bestlen = 0;
	int curpos = 0;
	int curlen = 0;
	int i;

	/* First of all, preprocess the address and find the longest run of zeros */
	for (i = 0; i < 8; i++) {
		uint32_t x = a[i / 2];

		words[i] = ((i % 2) ? x : (x >> 16)) & 0xffff;
		if (words[i]) {
			curlen = 0;
		} else {
			if (!curlen)
				curpos = i;
			curlen++;
			if (curlen > bestlen) {
				bestpos = curpos;
				bestlen = curlen;
			}
		}
	}
	if (bestlen < 2)
		bestpos = -1;

	/* Is it an encapsulated IPv4 address? */
	if (!bestpos && ((bestlen == 5 && a[2] == 0xffff) || bestlen == 6))
	// if (!bestpos && ((bestlen == 5 && (a[2] == 0xffff)) || bestlen == 6))
	{
		uint32_t x = a[3];

		b += sprintf(b, "::%s%d.%d.%d.%d", a[2] ? "ffff:" : "", ((x >> 24) & 0xff), ((x >> 16) & 0xff),
			     ((x >> 8) & 0xff), (x & 0xff));
		return 0;
	}

	/* Normal IPv6 formatting, compress the largest sequence of zeros */
	for (i = 0; i < 8; i++) {
		if (i == bestpos) {
			i += bestlen - 1;
			*b++ = ':';
			if (i == 7)
				*b++ = ':';
		} else {
			if (i)
				*b++ = ':';
			b += sprintf(b, "%x", words[i]);
		}
	}
	*b = '\0';
	return 0;
}